

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O2

bool __thiscall
MemTable::_put(MemTable *this,NodePosi pred_node,longlong key,string *value,bool delete_flag)

{
  list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_> *this_00;
  result_type_conflict rVar1;
  int iVar2;
  time_t ts;
  NodePosi below_node;
  long lVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  QuadList<SSTableDataEntry> local_d0;
  undefined1 local_b0 [64];
  undefined1 local_70 [64];
  
  if (_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::seed == '\0') {
    iVar2 = __cxa_guard_acquire();
    if (iVar2 != 0) {
      _put::seed = time((time_t *)0x0);
      __cxa_guard_release();
    }
  }
  if (_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::gen == '\0') {
    iVar2 = __cxa_guard_acquire();
    if (iVar2 != 0) {
      std::
      mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
      ::seed(&_put::gen,_put::seed);
      __cxa_guard_release();
    }
  }
  if (_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::rand == '\0') {
    iVar2 = __cxa_guard_acquire();
    if (iVar2 != 0) {
      _put::rand._M_param._M_a = 0;
      _put::rand._M_param._M_b = 1;
      __cxa_guard_release();
    }
  }
  ts = time((time_t *)0x0);
  p_Var4 = (this->qlist).
           super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  SSTableDataEntry::SSTableDataEntry((SSTableDataEntry *)local_70,delete_flag,ts,key,value);
  below_node = QuadList<SSTableDataEntry>::insertAfterAbove
                         ((QuadList<SSTableDataEntry> *)(p_Var4 + 1),(SSTableDataEntry *)local_70,
                          pred_node,(NodePosi)0x0);
  std::__cxx11::string::~string((string *)(local_70 + 0x20));
  if (below_node == (NodePosi)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = (below_node->data).value._M_string_length + 0x19;
  }
  this->_size_bytes = this->_size_bytes + lVar3;
  this_00 = &this->qlist;
  p_Var4 = (_List_node_base *)this_00;
  do {
    rVar1 = std::uniform_int_distribution<int>::operator()(&_put::rand,&_put::gen);
    if (rVar1 == 0) {
      this->_size = this->_size + 1;
      return true;
    }
    p_Var5 = p_Var4->_M_prev;
    for (; pred_node->above == (QuadListNode<SSTableDataEntry> *)0x0; pred_node = pred_node->pred) {
      if (((NodePosi)p_Var5[1]._M_prev == pred_node) || ((NodePosi)p_Var5[2]._M_next == pred_node))
      {
        if (p_Var5 == (this_00->
                      super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                      )._M_impl._M_node.super__List_node_base._M_next) {
          QuadList<SSTableDataEntry>::QuadList(&local_d0);
          std::__cxx11::
          list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::push_front
                    (this_00,&local_d0);
          QuadList<SSTableDataEntry>::~QuadList(&local_d0);
          p_Var5 = p_Var4->_M_prev;
        }
        p_Var4 = p_Var5->_M_prev;
        pred_node = (NodePosi)p_Var4[1]._M_prev;
        goto LAB_00105079;
      }
    }
    p_Var4 = p_Var5->_M_prev;
    pred_node = pred_node->above;
LAB_00105079:
    SSTableDataEntry::SSTableDataEntry((SSTableDataEntry *)local_b0,delete_flag,0,key,"");
    below_node = QuadList<SSTableDataEntry>::insertAfterAbove
                           ((QuadList<SSTableDataEntry> *)(p_Var4 + 1),(SSTableDataEntry *)local_b0,
                            pred_node,below_node);
    std::__cxx11::string::~string((string *)(local_b0 + 0x20));
    p_Var4 = p_Var5;
  } while( true );
}

Assistant:

bool MemTable::_put(NodePosi pred_node, long long key, std::string value, bool delete_flag) {
    auto curr_level = qlist.rbegin(); // If skipSearch didn't find k, it must return a appropriate position
    // at the bottom of qlist for insert a new tower of k
    static auto seed = time(nullptr);
    static auto gen = std::mt19937_64{static_cast<unsigned long long> (seed)};
    static auto rand = std::uniform_int_distribution<>{0, 1};
    auto timestamp = time(nullptr);
    auto new_node = curr_level->insertAfterAbove(MemTableEntry{delete_flag, timestamp, key, std::move(value)},
                                                 pred_node);
    _size_bytes += size_of_node(new_node);
    while (rand(gen)) {
        while (!pred_node->above && curr_level->valid(pred_node))
            pred_node = pred_node->pred;
        if (pred_node->above) {
            // Find a node of a tower.
            pred_node = pred_node->above;
            curr_level++;
        } else {
            // Unable to find a tower higher than curr_level.
            if (--(curr_level.base()) == qlist.begin()) {
                // If the tower should grow though top of SkipList arrived, add a level as top
                qlist.push_front(MemTableLevel{});
            }
            curr_level++;
            pred_node = curr_level->first();
        }
        // Do not repeat data on upper node to save memory, because skipSearch always turn to bottom if hit.
        new_node = curr_level->insertAfterAbove(MemTableEntry{delete_flag, 0, key, ""}, pred_node, new_node);
    }
    _size++;
    return true;
}